

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptorwrapper.cpp
# Opt level: O2

off_t __thiscall DescriptorWrapper::seek(DescriptorWrapper *this,off_t offset,int whence)

{
  errType errorCode;
  __off_t _Var1;
  PosixException *this_00;
  int *piVar2;
  allocator<char> local_41;
  string local_40;
  
  _Var1 = lseek(this->m_fd,offset,whence);
  if (_Var1 != -1) {
    return _Var1;
  }
  this_00 = (PosixException *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  errorCode = *piVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Error while lseek",&local_41);
  PosixException::PosixException(this_00,errorCode,&local_40);
  __cxa_throw(this_00,&PosixException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

off_t DescriptorWrapper::seek(off_t offset, int whence) 
{
	off_t offt = lseek(m_fd, offset, whence);
	if (offt == (off_t)(-1))
		throw PosixException(errno, "Error while lseek");
	return offt;
}